

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecoratorGradient.cpp
# Opt level: O0

SharedPtr<Decorator> __thiscall
Rml::DecoratorLinearGradientInstancer::InstanceDecorator
          (DecoratorLinearGradientInstancer *this,String *name,PropertyDictionary *properties_,
          DecoratorInstancerInterface *param_3)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  Property *this_00;
  Property *this_01;
  Property *this_02;
  Property *this_03;
  Property *this_04;
  NumericValue value;
  vector<Rml::ColorStop,_std::allocator<Rml::ColorStop>_> *in_color_stops;
  element_type *this_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  SharedPtr<Decorator> SVar5;
  undefined1 local_90 [8];
  SharedPtr<Rml::DecoratorLinearGradient> decorator;
  bool repeating;
  ColorStopList *color_stop_list;
  float local_60;
  Direction direction;
  float angle;
  Corner corner;
  Property *p_color_stop_list;
  Property *p_direction_y;
  Property *p_direction_x;
  Property *p_direction_to;
  Property *p_angle;
  DecoratorInstancerInterface *param_3_local;
  PropertyDictionary *properties__local;
  String *name_local;
  DecoratorLinearGradientInstancer *this_local;
  
  this_00 = PropertyDictionary::GetProperty
                      ((PropertyDictionary *)param_3,name[3].field_2._M_local_buf[8]);
  this_01 = PropertyDictionary::GetProperty
                      ((PropertyDictionary *)param_3,name[3].field_2._M_local_buf[9]);
  this_02 = PropertyDictionary::GetProperty
                      ((PropertyDictionary *)param_3,name[3].field_2._M_local_buf[10]);
  this_03 = PropertyDictionary::GetProperty
                      ((PropertyDictionary *)param_3,name[3].field_2._M_local_buf[0xb]);
  this_04 = PropertyDictionary::GetProperty
                      ((PropertyDictionary *)param_3,name[3].field_2._M_local_buf[0xc]);
  if ((((this_00 == (Property *)0x0) || (this_01 == (Property *)0x0)) ||
      (this_02 == (Property *)0x0)) ||
     ((this_03 == (Property *)0x0 || (this_04 == (Property *)0x0)))) {
    ::std::shared_ptr<Rml::Decorator>::shared_ptr((shared_ptr<Rml::Decorator> *)this,(nullptr_t)0x0)
    ;
    _Var4._M_pi = extraout_RDX;
  }
  else {
    direction = Bottom;
    local_60 = 0.0;
    bVar1 = Property::Get<bool>(this_01);
    if (bVar1) {
      uVar2 = Property::Get<int>(this_02);
      uVar3 = Property::Get<int>(this_03);
      switch(uVar2 | uVar3) {
      case 0:
      default:
        ::std::shared_ptr<Rml::Decorator>::shared_ptr
                  ((shared_ptr<Rml::Decorator> *)this,(nullptr_t)0x0);
        _Var4._M_pi = extraout_RDX_00;
        goto LAB_00524a91;
      case 1:
        local_60 = 0.0;
        break;
      case 2:
        local_60 = 1.5707964;
        break;
      case 3:
        direction = None;
        break;
      case 4:
        local_60 = 3.1415927;
        break;
      case 6:
        direction = Top;
        break;
      case 8:
        local_60 = 4.712389;
        break;
      case 9:
        direction = TopRight;
        break;
      case 0xc:
        direction = Right;
      }
    }
    else {
      value = Property::GetNumericValue(this_00);
      local_60 = ComputeAngle(value);
    }
    if (this_04->unit == COLORSTOPLIST) {
      in_color_stops =
           Variant::GetReference<std::vector<Rml::ColorStop,std::allocator<Rml::ColorStop>>>
                     (&this_04->value);
      decorator.super___shared_ptr<Rml::DecoratorLinearGradient,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi._7_1_ =
           ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             properties_,"repeating-linear-gradient");
      MakeShared<Rml::DecoratorLinearGradient>();
      this_05 = ::std::
                __shared_ptr_access<Rml::DecoratorLinearGradient,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<Rml::DecoratorLinearGradient,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_90);
      bVar1 = DecoratorLinearGradient::Initialise
                        (this_05,(bool)(decorator.
                                        super___shared_ptr<Rml::DecoratorLinearGradient,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount._M_pi._7_1_ & 1),direction,local_60,
                         in_color_stops);
      if (bVar1) {
        ::std::shared_ptr<Rml::Decorator>::shared_ptr<Rml::DecoratorLinearGradient,void>
                  ((shared_ptr<Rml::Decorator> *)this,
                   (shared_ptr<Rml::DecoratorLinearGradient> *)local_90);
      }
      else {
        ::std::shared_ptr<Rml::Decorator>::shared_ptr
                  ((shared_ptr<Rml::Decorator> *)this,(nullptr_t)0x0);
      }
      ::std::shared_ptr<Rml::DecoratorLinearGradient>::~shared_ptr
                ((shared_ptr<Rml::DecoratorLinearGradient> *)local_90);
      _Var4._M_pi = extraout_RDX_02;
    }
    else {
      ::std::shared_ptr<Rml::Decorator>::shared_ptr
                ((shared_ptr<Rml::Decorator> *)this,(nullptr_t)0x0);
      _Var4._M_pi = extraout_RDX_01;
    }
  }
LAB_00524a91:
  SVar5.super___shared_ptr<Rml::Decorator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var4._M_pi;
  SVar5.super___shared_ptr<Rml::Decorator,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
  ;
  return (SharedPtr<Decorator>)SVar5.super___shared_ptr<Rml::Decorator,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

SharedPtr<Decorator> DecoratorLinearGradientInstancer::InstanceDecorator(const String& name, const PropertyDictionary& properties_,
	const DecoratorInstancerInterface& /*interface_*/)
{
	const Property* p_angle = properties_.GetProperty(ids.angle);
	const Property* p_direction_to = properties_.GetProperty(ids.direction_to);
	const Property* p_direction_x = properties_.GetProperty(ids.direction_x);
	const Property* p_direction_y = properties_.GetProperty(ids.direction_y);
	const Property* p_color_stop_list = properties_.GetProperty(ids.color_stop_list);

	if (!p_angle || !p_direction_to || !p_direction_x || !p_direction_y || !p_color_stop_list)
		return nullptr;

	using Corner = DecoratorLinearGradient::Corner;
	Corner corner = Corner::None;
	float angle = 0.f;

	if (p_direction_to->Get<bool>())
	{
		const Direction direction = (Direction)(p_direction_x->Get<int>() | p_direction_y->Get<int>());
		switch (direction)
		{
		case Direction::Top: angle = 0.f; break;
		case Direction::Right: angle = 0.5f * Math::RMLUI_PI; break;
		case Direction::Bottom: angle = Math::RMLUI_PI; break;
		case Direction::Left: angle = 1.5f * Math::RMLUI_PI; break;
		case Direction::TopLeft: corner = Corner::TopLeft; break;
		case Direction::TopRight: corner = Corner::TopRight; break;
		case Direction::BottomRight: corner = Corner::BottomRight; break;
		case Direction::BottomLeft: corner = Corner::BottomLeft; break;
		case Direction::None:
		default: return nullptr; break;
		}
	}
	else
	{
		angle = ComputeAngle(p_angle->GetNumericValue());
	}

	if (p_color_stop_list->unit != Unit::COLORSTOPLIST)
		return nullptr;
	const ColorStopList& color_stop_list = p_color_stop_list->value.GetReference<ColorStopList>();
	const bool repeating = (name == "repeating-linear-gradient");

	auto decorator = MakeShared<DecoratorLinearGradient>();
	if (decorator->Initialise(repeating, corner, angle, color_stop_list))
		return decorator;

	return nullptr;
}